

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeMoveImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  MCOperand *Op;
  uint shift;
  uint imm;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  uVar1 = fieldFromInstruction(insn,5,0x10);
  uVar2 = fieldFromInstruction(insn,0x15,2);
  uVar3 = MCInst_getOpcode(Inst);
  if (uVar3 == 0x452) {
LAB_001a6a5c:
    if ((uVar2 << 4 & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  else {
    if (uVar3 != 0x453) {
      if (uVar3 == 0x454) goto LAB_001a6a5c;
      if (uVar3 != 0x455) {
        if (uVar3 == 0x456) goto LAB_001a6a5c;
        if (uVar3 != 0x457) {
          return MCDisassembler_Fail;
        }
      }
    }
    DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  uVar3 = MCInst_getOpcode(Inst);
  if ((uVar3 == 0x452) || (uVar3 = MCInst_getOpcode(Inst), uVar3 == 0x453)) {
    Op = MCInst_getOperand(Inst,0);
    MCInst_addOperand2(Inst,Op);
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar1);
  MCOperand_CreateImm0(Inst,(ulong)(uVar2 << 4));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMoveImmInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned imm = fieldFromInstruction(insn, 5, 16);
	unsigned shift = fieldFromInstruction(insn, 21, 2);

	shift <<= 4;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_MOVZWi:
		case AArch64_MOVNWi:
		case AArch64_MOVKWi:
			if (shift & (1U << 5))
				return Fail;
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
			break;
		case AArch64_MOVZXi:
		case AArch64_MOVNXi:
		case AArch64_MOVKXi:
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
			break;
	}

	if (MCInst_getOpcode(Inst) == AArch64_MOVKWi ||
			MCInst_getOpcode(Inst) == AArch64_MOVKXi)
		MCInst_addOperand2(Inst, MCInst_getOperand(Inst, 0));

	MCOperand_CreateImm0(Inst, imm);
	MCOperand_CreateImm0(Inst, shift);
	return Success;
}